

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateMessageSerializationMethods
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  bool bVar2;
  FieldDescriptor **ppFVar3;
  ImmutableFieldGenerator *pIVar4;
  int i;
  int iVar5;
  long lVar6;
  char *pcVar7;
  Printer *this_00;
  int i_1;
  long lVar8;
  ulong uVar9;
  scoped_array<const_google::protobuf::FieldDescriptor_*> sorted_fields;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  sorted_extensions;
  scoped_array<const_google::protobuf::FieldDescriptor_*> local_90;
  _Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  local_88;
  undefined1 local_70 [32];
  string local_50;
  
  local_90.array_ = SortFieldsByNumber((this->super_MessageGenerator).descriptor_);
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar8 = 0;
  lVar6 = 0;
  while( true ) {
    pDVar1 = (this->super_MessageGenerator).descriptor_;
    if (*(int *)(pDVar1 + 0x68) <= lVar6) break;
    local_70._0_8_ = *(long *)(pDVar1 + 0x70) + lVar8;
    std::
    vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
    ::emplace_back<google::protobuf::Descriptor::ExtensionRange_const*>
              ((vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
                *)&local_88,(ExtensionRange **)local_70);
    lVar6 = lVar6 + 1;
    lVar8 = lVar8 + 8;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::java::ExtensionRangeOrdering>>
            (local_88._M_impl.super__Vector_impl_data._M_start,
             local_88._M_impl.super__Vector_impl_data._M_finish);
  io::Printer::Print(printer,
                     "public void writeTo(com.google.protobuf.CodedOutputStream output)\n                    throws java.io.IOException {\n"
                    );
  io::Printer::Indent(printer);
  this_00 = (Printer *)(this->super_MessageGenerator).descriptor_;
  bVar2 = HasPackedFields((Descriptor *)this_00);
  if (bVar2) {
    this_00 = printer;
    io::Printer::Print(printer,"getSerializedSize();\n");
  }
  pDVar1 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar1 + 0x68)) {
    if (*(char *)(*(long *)(pDVar1 + 0x20) + 0x68) == '\x01') {
      ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                ((string *)local_70,this->name_resolver_,pDVar1);
      GeneratedCodeVersionSuffix_abi_cxx11_();
      io::Printer::Print(printer,
                         "com.google.protobuf.GeneratedMessage$ver$\n  .ExtendableMessage<$classname$>.ExtensionWriter\n    extensionWriter = newMessageSetExtensionWriter();\n"
                         ,"classname",(string *)local_70,"ver",(string *)(local_70 + 0x20));
    }
    else {
      ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                ((string *)local_70,this->name_resolver_,pDVar1);
      GeneratedCodeVersionSuffix_abi_cxx11_();
      io::Printer::Print(printer,
                         "com.google.protobuf.GeneratedMessage$ver$\n  .ExtendableMessage<$classname$>.ExtensionWriter\n    extensionWriter = newExtensionWriter();\n"
                         ,"classname",(string *)local_70,"ver",(string *)(local_70 + 0x20));
    }
    std::__cxx11::string::~string((string *)(local_70 + 0x20));
    this_00 = (Printer *)local_70;
    std::__cxx11::string::~string((string *)this_00);
  }
  iVar5 = 0;
  uVar9 = 0;
LAB_0028fa92:
  lVar6 = (long)iVar5;
  uVar9 = (ulong)(int)uVar9;
  do {
    pDVar1 = (this->super_MessageGenerator).descriptor_;
    if ((*(int *)(pDVar1 + 0x2c) <= iVar5) &&
       ((ulong)((long)local_88._M_impl.super__Vector_impl_data._M_finish -
                (long)local_88._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar9)) {
      if (*(int *)(*(long *)(pDVar1 + 0x10) + 0x8c) != 3) {
        pcVar7 = "unknownFields.writeTo(output);\n";
        if (*(char *)(*(long *)(pDVar1 + 0x20) + 0x68) != '\0') {
          pcVar7 = "unknownFields.writeAsMessageSetTo(output);\n";
        }
        io::Printer::Print(printer,pcVar7);
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,
                         "}\n\npublic int getSerializedSize() {\n  int size = memoizedSize;\n  if (size != -1) return size;\n\n  size = 0;\n"
                        );
      io::Printer::Indent(printer);
      for (lVar6 = 0; pDVar1 = (this->super_MessageGenerator).descriptor_,
          lVar6 < *(int *)(pDVar1 + 0x2c); lVar6 = lVar6 + 1) {
        ppFVar3 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                            (&local_90,lVar6);
        pIVar4 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                           (&this->field_generators_,*ppFVar3);
        (*pIVar4->_vptr_ImmutableFieldGenerator[0xf])(pIVar4,printer);
      }
      if (0 < *(int *)(pDVar1 + 0x68)) {
        pcVar7 = "size += extensionsSerializedSize();\n";
        if (*(char *)(*(long *)(pDVar1 + 0x20) + 0x68) != '\0') {
          pcVar7 = "size += extensionsSerializedSizeAsMessageSet();\n";
        }
        io::Printer::Print(printer,pcVar7);
      }
      pDVar1 = (this->super_MessageGenerator).descriptor_;
      if (*(int *)(*(long *)(pDVar1 + 0x10) + 0x8c) != 3) {
        pcVar7 = "size += unknownFields.getSerializedSize();\n";
        if (*(char *)(*(long *)(pDVar1 + 0x20) + 0x68) != '\0') {
          pcVar7 = "size += unknownFields.getSerializedSizeAsMessageSet();\n";
        }
        io::Printer::Print(printer,pcVar7);
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"  memoizedSize = size;\n  return size;\n}\n\n");
      io::Printer::Print(printer,"private static final long serialVersionUID = 0L;\n");
      std::
      _Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
      ::~_Vector_base(&local_88);
      internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::~scoped_array(&local_90);
      return;
    }
    if (iVar5 == *(int *)(pDVar1 + 0x2c)) {
      GenerateSerializeOneExtensionRange
                ((ImmutableMessageGenerator *)this_00,printer,
                 (ExtensionRange *)
                 ((ZeroCopyOutputStream *)
                 (local_88._M_impl.super__Vector_impl_data._M_start + uVar9))->
                 _vptr_ZeroCopyOutputStream);
    }
    else {
      if (uVar9 == (long)local_88._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_88._M_impl.super__Vector_impl_data._M_start >> 3) {
        ppFVar3 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                            (&local_90,lVar6);
        this_00 = (Printer *)this;
        GenerateSerializeOneField(this,printer,*ppFVar3);
        goto LAB_0028fb3e;
      }
      this_00 = (Printer *)&local_90;
      ppFVar3 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                          (&local_90,lVar6);
      if (*(int *)(*ppFVar3 + 0x38) <
          ((ExtensionRange *)
          ((ZeroCopyOutputStream *)(local_88._M_impl.super__Vector_impl_data._M_start + uVar9))->
          _vptr_ZeroCopyOutputStream)->start) break;
      GenerateSerializeOneExtensionRange
                ((ImmutableMessageGenerator *)this_00,printer,
                 (ExtensionRange *)
                 ((ZeroCopyOutputStream *)
                 (local_88._M_impl.super__Vector_impl_data._M_start + uVar9))->
                 _vptr_ZeroCopyOutputStream);
    }
    uVar9 = uVar9 + 1;
  } while( true );
  ppFVar3 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                      (&local_90,lVar6);
  this_00 = (Printer *)this;
  GenerateSerializeOneField(this,printer,*ppFVar3);
LAB_0028fb3e:
  iVar5 = iVar5 + 1;
  goto LAB_0028fa92;
}

Assistant:

void ImmutableMessageGenerator::
GenerateMessageSerializationMethods(io::Printer* printer) {
  google::protobuf::scoped_array<const FieldDescriptor * > sorted_fields(
      SortFieldsByNumber(descriptor_));

  std::vector<const Descriptor::ExtensionRange*> sorted_extensions;
  for (int i = 0; i < descriptor_->extension_range_count(); ++i) {
    sorted_extensions.push_back(descriptor_->extension_range(i));
  }
  std::sort(sorted_extensions.begin(), sorted_extensions.end(),
            ExtensionRangeOrdering());
  printer->Print(
    "public void writeTo(com.google.protobuf.CodedOutputStream output)\n"
    "                    throws java.io.IOException {\n");
  printer->Indent();
  if (HasPackedFields(descriptor_)) {
    // writeTo(CodedOutputStream output) might be invoked without
    // getSerializedSize() ever being called, but we need the memoized
    // sizes in case this message has packed fields. Rather than emit checks for
    // each packed field, just call getSerializedSize() up front.
    // In most cases, getSerializedSize() will have already been called anyway
    // by one of the wrapper writeTo() methods, making this call cheap.
    printer->Print(
      "getSerializedSize();\n");
  }

  if (descriptor_->extension_range_count() > 0) {
    if (descriptor_->options().message_set_wire_format()) {
      printer->Print(
        "com.google.protobuf.GeneratedMessage$ver$\n"
        "  .ExtendableMessage<$classname$>.ExtensionWriter\n"
        "    extensionWriter = newMessageSetExtensionWriter();\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "ver", GeneratedCodeVersionSuffix());
    } else {
      printer->Print(
        "com.google.protobuf.GeneratedMessage$ver$\n"
        "  .ExtendableMessage<$classname$>.ExtensionWriter\n"
        "    extensionWriter = newExtensionWriter();\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "ver", GeneratedCodeVersionSuffix());
    }
  }

  // Merge the fields and the extension ranges, both sorted by field number.
  for (int i = 0, j = 0;
       i < descriptor_->field_count() || j < sorted_extensions.size();
       ) {
    if (i == descriptor_->field_count()) {
      GenerateSerializeOneExtensionRange(printer, sorted_extensions[j++]);
    } else if (j == sorted_extensions.size()) {
      GenerateSerializeOneField(printer, sorted_fields[i++]);
    } else if (sorted_fields[i]->number() < sorted_extensions[j]->start) {
      GenerateSerializeOneField(printer, sorted_fields[i++]);
    } else {
      GenerateSerializeOneExtensionRange(printer, sorted_extensions[j++]);
    }
  }

  if (PreserveUnknownFields(descriptor_)) {
    if (descriptor_->options().message_set_wire_format()) {
      printer->Print(
        "unknownFields.writeAsMessageSetTo(output);\n");
    } else {
      printer->Print(
        "unknownFields.writeTo(output);\n");
    }
  }

  printer->Outdent();
  printer->Print(
    "}\n"
    "\n"
    "public int getSerializedSize() {\n"
    "  int size = memoizedSize;\n"
    "  if (size != -1) return size;\n"
    "\n"
    "  size = 0;\n");
  printer->Indent();

  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(sorted_fields[i]).GenerateSerializedSizeCode(printer);
  }

  if (descriptor_->extension_range_count() > 0) {
    if (descriptor_->options().message_set_wire_format()) {
      printer->Print(
        "size += extensionsSerializedSizeAsMessageSet();\n");
    } else {
      printer->Print(
        "size += extensionsSerializedSize();\n");
    }
  }

  if (PreserveUnknownFields(descriptor_)) {
    if (descriptor_->options().message_set_wire_format()) {
      printer->Print(
        "size += unknownFields.getSerializedSizeAsMessageSet();\n");
    } else {
      printer->Print(
        "size += unknownFields.getSerializedSize();\n");
    }
  }

  printer->Outdent();
  printer->Print(
    "  memoizedSize = size;\n"
    "  return size;\n"
    "}\n"
    "\n");

  printer->Print(
    "private static final long serialVersionUID = 0L;\n");
}